

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

DynamicObject * __thiscall
JsrtDebuggerObjectScope::GetChildren
          (JsrtDebuggerObjectScope *this,ScriptContext *scriptContext,uint fromCount,uint totalCount
          )

{
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar1;
  IDiagObjectModelDisplay *pIVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  DynamicObject *pDVar5;
  
  pWVar1 = this->objectDisplay;
  bVar3 = Memory::ReferencedArenaAdapter::AddStrongReference(pWVar1->adapter);
  pIVar2 = pWVar1->p;
  if (pIVar2 == (IDiagObjectModelDisplay *)0x0 || !bVar3) {
    pDVar5 = (DynamicObject *)0x0;
  }
  else {
    if (this->walkerRef == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
      iVar4 = (*pIVar2->_vptr_IDiagObjectModelDisplay[7])();
      this->walkerRef =
           (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)CONCAT44(extraout_var,iVar4);
    }
    pDVar5 = JsrtDebuggerObjectBase::GetChildren
                       (&this->super_JsrtDebuggerObjectBase,this->walkerRef,scriptContext,fromCount,
                        totalCount);
    Memory::ReferencedArenaAdapter::ReleaseStrongReference(this->objectDisplay->adapter);
  }
  return pDVar5;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectScope::GetChildren(Js::ScriptContext * scriptContext, uint fromCount, uint totalCount)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = objectDisplay->GetStrongReference();
    if (objectDisplayRef == nullptr)
    {
        return nullptr;
    }

    if (this->walkerRef == nullptr)
    {
        this->walkerRef = objectDisplayRef->CreateWalker();
    }

    Js::DynamicObject* childrens = __super::GetChildren(this->walkerRef, scriptContext, fromCount, totalCount);

    objectDisplay->ReleaseStrongReference();

    return childrens;
}